

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

curl_hash * Curl_global_host_cache_init(void)

{
  curl_hash *pcVar1;
  int local_c;
  int rc;
  
  local_c = 0;
  if ((host_cache_initialized == 0) &&
     (local_c = Curl_hash_init(&hostname_cache,7,Curl_hash_str,Curl_str_key_compare,freednsentry),
     local_c == 0)) {
    host_cache_initialized = 1;
  }
  pcVar1 = &hostname_cache;
  if (local_c != 0) {
    pcVar1 = (curl_hash *)0x0;
  }
  return pcVar1;
}

Assistant:

struct curl_hash *Curl_global_host_cache_init(void)
{
  int rc = 0;
  if(!host_cache_initialized) {
    rc = Curl_hash_init(&hostname_cache, 7, Curl_hash_str,
                        Curl_str_key_compare, freednsentry);
    if(!rc)
      host_cache_initialized = 1;
  }
  return rc?NULL:&hostname_cache;
}